

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_rotate_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg1;
  uint left;
  TCGTemp *pTVar1;
  TCGv_i32 pTVar2;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i32 ret;
  uint uVar3;
  uintptr_t o_2;
  TCGv_i32 ret_00;
  
  s_00 = s->uc->tcg_ctx;
  left = insn & 0x100;
  uVar3 = insn & 7;
  pTVar2 = s_00->cpu_dregs[uVar3];
  arg1 = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(insn >> 6 & 0x38));
  pTVar1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar1 - (long)s_00);
  tcg_gen_andi_i32_m68k(s_00,ret_00,arg1,0x3f);
  pTVar1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)pTVar1 - (long)s_00);
  if ((insn & 8) == 0) {
    tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)pTVar1,0x21);
    tcg_gen_remu_i32_m68k(s_00,ret,ret_00,ret);
    pTVar2 = rotate32_x(s_00,s_00->cpu_dregs[uVar3],ret,left);
    rotate_x_flags(s_00,s_00->cpu_dregs[uVar3],pTVar2,0x20);
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
  }
  else {
    tcg_gen_andi_i32_m68k(s_00,ret,arg1,0x1f);
    rotate(s_00,pTVar2,ret,left,0x20);
    tcg_gen_movcond_i32_m68k(s_00,TCG_COND_EQ,QREG_CC_C,ret_00,QREG_CC_V,QREG_CC_V,QREG_CC_C);
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

DISAS_INSN(rotate_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv src;
    TCGv t0, t1;
    int left = (insn & 0x100);

    reg = DREG(insn, 0);
    src = DREG(insn, 9);
    /* shift in [0..63] */
    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_i32(tcg_ctx, t0, src, 63);
    t1 = tcg_temp_new_i32(tcg_ctx);
    if (insn & 8) {
        tcg_gen_andi_i32(tcg_ctx, t1, src, 31);
        rotate(tcg_ctx, reg, t1, left, 32);
        /* if shift == 0, clear C */
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, QREG_CC_C,
                            t0, QREG_CC_V /* 0 */,
                            QREG_CC_V /* 0 */, QREG_CC_C);
    } else {
        TCGv X;
        /* modulo 33 */
        tcg_gen_movi_i32(tcg_ctx, t1, 33);
        tcg_gen_remu_i32(tcg_ctx, t1, t0, t1);
        X = rotate32_x(tcg_ctx, DREG(insn, 0), t1, left);
        rotate_x_flags(tcg_ctx, DREG(insn, 0), X, 32);
        tcg_temp_free(tcg_ctx, X);
    }
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);
    set_cc_op(s, CC_OP_FLAGS);
}